

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O2

void __thiscall QConfFileSettingsPrivate::sync(QConfFileSettingsPrivate *this)

{
  QMutex *this_00;
  QConfFile **ppQVar1;
  long lVar2;
  QConfFile *confFile;
  long lVar3;
  
  ppQVar1 = (this->confFiles).d.ptr;
  lVar2 = (this->confFiles).d.size;
  for (lVar3 = 0; lVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    confFile = *(QConfFile **)((long)ppQVar1 + lVar3);
    this_00 = &confFile->mutex;
    QBasicMutex::lock(&this_00->super_QBasicMutex);
    syncConfFile(this,confFile);
    QBasicMutex::unlock(&this_00->super_QBasicMutex);
  }
  return;
}

Assistant:

void QConfFileSettingsPrivate::sync()
{
    // people probably won't be checking the status a whole lot, so in case of
    // error we just try to go on and make the best of it

    for (auto confFile : std::as_const(confFiles)) {
        const auto locker = qt_scoped_lock(confFile->mutex);
        syncConfFile(confFile);
    }
}